

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

void SUNDlsMat_denseScale(realtype c,realtype **a,sunindextype m,sunindextype n)

{
  realtype *prVar1;
  realtype *col_j;
  sunindextype j;
  sunindextype i;
  sunindextype n_local;
  sunindextype m_local;
  realtype **a_local;
  realtype c_local;
  
  for (j = 0; j < n; j = j + 1) {
    prVar1 = a[j];
    for (i = 0; i < m; i = i + 1) {
      prVar1[i] = c * prVar1[i];
    }
  }
  return;
}

Assistant:

void SUNDlsMat_denseScale(realtype c, realtype **a, sunindextype m, sunindextype n)
{
  sunindextype i, j;
  realtype *col_j;

  for (j=0; j < n; j++) {
    col_j = a[j];
    for (i=0; i < m; i++)
      col_j[i] *= c;
  }
}